

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_59::ThrowingErrorReporter::addError
          (ThrowingErrorReporter *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  ulong uVar1;
  int line;
  ulong uVar2;
  bool bVar3;
  StringPtr message_local;
  Array<char> local_1c0;
  Exception local_1a8;
  
  message_local.content.size_ = message.content.size_;
  message_local.content.ptr = message.content.ptr;
  line = 1;
  uVar1 = 0;
  for (uVar2 = 0; startByte != uVar2; uVar2 = uVar2 + 1) {
    bVar3 = (this->input).content.ptr[uVar2] == '\n';
    if (bVar3) {
      uVar1 = uVar2 & 0xffffffff;
    }
    line = line + (uint)bVar3;
  }
  kj::str<unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[3],kj::StringPtr&>
            ((String *)&local_1c0,(kj *)&stack0xfffffffffffffe2c,(uint *)0x20ae24,
             (char (*) [2])&stack0xfffffffffffffe28,(uint *)0x1e369c,(char (*) [3])&message_local,
             (StringPtr *)CONCAT44(startByte - (int)uVar1,endByte - (int)uVar1));
  kj::Exception::Exception(&local_1a8,FAILED,"(capnp text input)",line,(String *)&local_1c0);
  kj::throwRecoverableException(&local_1a8,0);
  kj::Exception::~Exception(&local_1a8);
  kj::Array<char>::~Array(&local_1c0);
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    // Note: Line and column numbers are usually 1-based.
    uint line = 1;
    uint32_t lineStart = 0;
    for (auto i: kj::zeroTo(startByte)) {
      if (input[i] == '\n') {
        ++line;
        lineStart = i;  // Omit +1 so that column is 1-based.
      }
    }

    kj::throwRecoverableException(kj::Exception(
      kj::Exception::Type::FAILED, "(capnp text input)", line,
      kj::str(startByte - lineStart, "-", endByte - lineStart, ": ", message)
    ));
  }